

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O2

ImfLut * ImfNewRound12logLut(int channels)

{
  RgbaLut *this;
  
  this = (RgbaLut *)operator_new(0x10);
  Imf_3_4::RgbaLut::RgbaLut<Imath_3_2::half(*)(Imath_3_2::half)>(this,Imf_3_4::round12log,channels);
  return (ImfLut *)this;
}

Assistant:

ImfLut*
ImfNewRound12logLut (int channels)
{
    try
    {
        return (ImfLut*) new OPENEXR_IMF_INTERNAL_NAMESPACE::RgbaLut (
            OPENEXR_IMF_INTERNAL_NAMESPACE::round12log,
            OPENEXR_IMF_INTERNAL_NAMESPACE::RgbaChannels (channels));
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}